

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_2_5::jacobiEigenSolver<double>
               (Matrix44<double> *A,Vec4<double> *S,Matrix44<double> *V,double tol)

{
  int i;
  long lVar1;
  double *pdVar2;
  int i_1;
  uint uVar3;
  bool bVar4;
  BaseType_conflict BVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_68 [5];
  double local_40;
  double local_38;
  
  V->x[1][1] = 0.0;
  V->x[1][2] = 0.0;
  V->x[2][1] = 0.0;
  V->x[2][2] = 0.0;
  V->x[3][1] = 0.0;
  V->x[3][2] = 0.0;
  V->x[2][3] = 0.0;
  V->x[3][0] = 0.0;
  V->x[1][3] = 0.0;
  V->x[2][0] = 0.0;
  V->x[0][3] = 0.0;
  V->x[1][0] = 0.0;
  V->x[0][1] = 0.0;
  V->x[0][2] = 0.0;
  V->x[0][0] = 1.0;
  V->x[1][1] = 1.0;
  V->x[2][2] = 1.0;
  V->x[3][3] = 1.0;
  pdVar2 = (double *)A;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    (&S->x)[lVar1] = *pdVar2;
    pdVar2 = pdVar2 + 5;
  }
  local_40 = tol;
  BVar5 = (anonymous_namespace)::maxOffDiagSymm<Imath_2_5::Matrix44<double>>(A);
  local_38 = BVar5 * local_40;
  if ((local_38 != 0.0) || (NAN(local_38))) {
    uVar3 = 0;
    do {
      local_68[2] = 0.0;
      local_68[3] = 0.0;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      dVar13 = A->x[0][0];
      dVar10 = A->x[0][1];
      dVar8 = A->x[1][1];
      dVar6 = dVar8 - dVar13;
      if (ABS(dVar10 + dVar10) <= ABS(dVar6) * local_40) {
        A->x[0][1] = 0.0;
      }
      else {
        dVar6 = dVar6 / (dVar10 + dVar10);
        dVar9 = *(double *)(&DAT_0010f220 + (ulong)(dVar6 < 0.0) * 8) /
                (SQRT(dVar6 * dVar6 + 1.0) + ABS(dVar6));
        dVar6 = 1.0 / SQRT(dVar9 * dVar9 + 1.0);
        dVar10 = dVar10 * dVar9;
        dVar9 = dVar9 * dVar6;
        dVar7 = dVar9 / (dVar6 + 1.0);
        local_68[0] = 0.0 - dVar10;
        local_68[1] = dVar10 + 0.0;
        A->x[0][0] = dVar13 - dVar10;
        A->x[1][1] = dVar8 + dVar10;
        A->x[0][1] = 0.0;
        dVar10 = A->x[0][2];
        dVar8 = A->x[0][3];
        dVar13 = A->x[1][2];
        dVar6 = A->x[1][3];
        A->x[0][2] = dVar10 - (dVar7 * dVar10 + dVar13) * dVar9;
        A->x[0][3] = dVar8 - (dVar7 * dVar8 + dVar6) * dVar9;
        A->x[1][2] = (dVar10 - dVar7 * dVar13) * dVar9 + dVar13;
        A->x[1][3] = (dVar8 - dVar7 * dVar6) * dVar9 + dVar6;
        for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
          pdVar2 = (double *)((long)V->x[0] + lVar1);
          dVar10 = *pdVar2;
          dVar8 = pdVar2[1];
          pdVar2 = (double *)((long)V->x[0] + lVar1);
          *pdVar2 = (dVar7 * dVar10 + dVar8) * -dVar9 + dVar10;
          pdVar2[1] = (-dVar7 * dVar8 + dVar10) * dVar9 + dVar8;
        }
        dVar13 = A->x[0][0];
      }
      dVar10 = A->x[0][2];
      dVar8 = A->x[2][2];
      dVar6 = dVar8 - dVar13;
      if (ABS(dVar10 + dVar10) <= ABS(dVar6) * local_40) {
        A->x[0][2] = 0.0;
      }
      else {
        dVar6 = dVar6 / (dVar10 + dVar10);
        dVar6 = *(double *)(&DAT_0010f220 + (ulong)(dVar6 < 0.0) * 8) /
                (SQRT(dVar6 * dVar6 + 1.0) + ABS(dVar6));
        dVar7 = 1.0 / SQRT(dVar6 * dVar6 + 1.0);
        dVar10 = dVar10 * dVar6;
        dVar6 = dVar6 * dVar7;
        local_68[0] = local_68[0] - dVar10;
        local_68[2] = dVar10 + 0.0;
        A->x[0][0] = dVar13 - dVar10;
        A->x[2][2] = dVar8 + dVar10;
        A->x[0][2] = 0.0;
        dVar7 = dVar6 / (dVar7 + 1.0);
        dVar10 = A->x[1][2];
        dVar8 = A->x[0][1];
        dVar13 = A->x[0][3];
        A->x[0][1] = dVar8 - (dVar7 * dVar8 + dVar10) * dVar6;
        A->x[1][2] = (dVar8 - dVar7 * dVar10) * dVar6 + dVar10;
        dVar10 = A->x[2][3];
        A->x[0][3] = dVar13 - (dVar7 * dVar13 + dVar10) * dVar6;
        A->x[2][3] = (dVar13 - dVar7 * dVar10) * dVar6 + dVar10;
        for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
          dVar10 = *(double *)((long)V->x[0] + lVar1);
          dVar8 = *(double *)((long)V->x[0] + lVar1 + 0x10);
          *(double *)((long)V->x[0] + lVar1) = (dVar7 * dVar10 + dVar8) * -dVar6 + dVar10;
          *(double *)((long)V->x[0] + lVar1 + 0x10) = (-dVar7 * dVar8 + dVar10) * dVar6 + dVar8;
        }
        dVar13 = A->x[0][0];
      }
      dVar10 = A->x[0][3];
      dVar8 = A->x[3][3];
      dVar6 = dVar8 - dVar13;
      if (ABS(dVar10 + dVar10) <= ABS(dVar6) * local_40) {
        A->x[0][3] = 0.0;
      }
      else {
        dVar6 = dVar6 / (dVar10 + dVar10);
        dVar7 = *(double *)(&DAT_0010f220 + (ulong)(dVar6 < 0.0) * 8) /
                (SQRT(dVar6 * dVar6 + 1.0) + ABS(dVar6));
        dVar6 = 1.0 / SQRT(dVar7 * dVar7 + 1.0);
        dVar10 = dVar10 * dVar7;
        dVar7 = dVar7 * dVar6;
        dVar9 = dVar7 / (dVar6 + 1.0);
        local_68[0] = local_68[0] - dVar10;
        local_68[3] = dVar10 + 0.0;
        A->x[0][0] = dVar13 - dVar10;
        A->x[3][3] = dVar8 + dVar10;
        A->x[0][3] = 0.0;
        dVar10 = A->x[1][3];
        dVar8 = A->x[2][3];
        dVar13 = A->x[0][1];
        dVar6 = A->x[0][2];
        A->x[1][3] = (dVar13 - dVar9 * dVar10) * dVar7 + dVar10;
        A->x[0][1] = dVar13 - dVar7 * (dVar9 * dVar13 + dVar10);
        A->x[0][2] = dVar6 - dVar7 * (dVar9 * dVar6 + dVar8);
        A->x[2][3] = (dVar6 - dVar9 * dVar8) * dVar7 + dVar8;
        for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
          dVar10 = *(double *)((long)V->x[0] + lVar1);
          dVar8 = *(double *)((long)V->x[0] + lVar1 + 0x18);
          *(double *)((long)V->x[0] + lVar1) = (dVar9 * dVar10 + dVar8) * -dVar7 + dVar10;
          *(double *)((long)V->x[0] + lVar1 + 0x18) = (-dVar9 * dVar8 + dVar10) * dVar7 + dVar8;
        }
      }
      dVar13 = A->x[1][1];
      dVar10 = A->x[1][2];
      dVar8 = A->x[2][2];
      dVar6 = dVar8 - dVar13;
      if (ABS(dVar10 + dVar10) <= ABS(dVar6) * local_40) {
        A->x[1][2] = 0.0;
      }
      else {
        dVar6 = dVar6 / (dVar10 + dVar10);
        dVar6 = *(double *)(&DAT_0010f220 + (ulong)(dVar6 < 0.0) * 8) /
                (SQRT(dVar6 * dVar6 + 1.0) + ABS(dVar6));
        dVar7 = 1.0 / SQRT(dVar6 * dVar6 + 1.0);
        dVar10 = dVar10 * dVar6;
        dVar6 = dVar6 * dVar7;
        local_68[1] = local_68[1] - dVar10;
        local_68[2] = local_68[2] + dVar10;
        A->x[1][1] = dVar13 - dVar10;
        A->x[2][2] = dVar8 + dVar10;
        A->x[1][2] = 0.0;
        dVar13 = dVar6 / (dVar7 + 1.0);
        dVar10 = A->x[0][1];
        dVar8 = A->x[0][2];
        A->x[0][1] = (dVar13 * dVar10 + dVar8) * -dVar6 + dVar10;
        A->x[0][2] = (-dVar13 * dVar8 + dVar10) * dVar6 + dVar8;
        dVar10 = A->x[1][3];
        dVar8 = A->x[2][3];
        A->x[1][3] = dVar10 - (dVar13 * dVar10 + dVar8) * dVar6;
        A->x[2][3] = (dVar10 - dVar13 * dVar8) * dVar6 + dVar8;
        for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
          pdVar2 = (double *)((long)V->x[0] + lVar1 + 8);
          dVar10 = *pdVar2;
          dVar8 = pdVar2[1];
          pdVar2 = (double *)((long)V->x[0] + lVar1 + 8);
          *pdVar2 = (dVar13 * dVar10 + dVar8) * -dVar6 + dVar10;
          pdVar2[1] = (-dVar13 * dVar8 + dVar10) * dVar6 + dVar8;
        }
        dVar13 = A->x[1][1];
      }
      dVar10 = A->x[1][3];
      dVar8 = A->x[3][3];
      if (ABS(dVar10 + dVar10) <= ABS(dVar8 - dVar13) * local_40) {
        A->x[1][3] = 0.0;
      }
      else {
        dVar6 = (dVar8 - dVar13) / (dVar10 + dVar10);
        dVar6 = *(double *)(&DAT_0010f220 + (ulong)(dVar6 < 0.0) * 8) /
                (SQRT(dVar6 * dVar6 + 1.0) + ABS(dVar6));
        dVar7 = 1.0 / SQRT(dVar6 * dVar6 + 1.0);
        dVar10 = dVar10 * dVar6;
        dVar6 = dVar6 * dVar7;
        local_68[1] = local_68[1] - dVar10;
        local_68[3] = local_68[3] + dVar10;
        A->x[1][1] = dVar13 - dVar10;
        A->x[3][3] = dVar8 + dVar10;
        A->x[1][3] = 0.0;
        dVar13 = dVar6 / (dVar7 + 1.0);
        dVar10 = A->x[0][1];
        dVar8 = A->x[0][3];
        A->x[0][1] = dVar10 - (dVar13 * dVar10 + dVar8) * dVar6;
        A->x[0][3] = (dVar10 - dVar13 * dVar8) * dVar6 + dVar8;
        dVar10 = A->x[1][2];
        dVar8 = A->x[2][3];
        A->x[1][2] = dVar10 - (dVar13 * dVar10 + dVar8) * dVar6;
        A->x[2][3] = (dVar10 - dVar13 * dVar8) * dVar6 + dVar8;
        for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
          dVar10 = *(double *)((long)V->x[0] + lVar1 + 8);
          dVar8 = *(double *)((long)V->x[0] + lVar1 + 0x18);
          *(double *)((long)V->x[0] + lVar1 + 8) = (dVar13 * dVar10 + dVar8) * -dVar6 + dVar10;
          *(double *)((long)V->x[0] + lVar1 + 0x18) = (-dVar13 * dVar8 + dVar10) * dVar6 + dVar8;
        }
        dVar8 = A->x[3][3];
      }
      dVar10 = A->x[2][2];
      dVar13 = A->x[2][3];
      dVar6 = dVar8 - dVar10;
      if (ABS(dVar13 + dVar13) <= ABS(dVar6) * local_40) {
        A->x[2][3] = 0.0;
      }
      else {
        dVar6 = dVar6 / (dVar13 + dVar13);
        dVar11 = *(double *)(&DAT_0010f220 + (ulong)(dVar6 < 0.0) * 8) /
                 (SQRT(dVar6 * dVar6 + 1.0) + ABS(dVar6));
        dVar6 = 1.0 / SQRT(dVar11 * dVar11 + 1.0);
        dVar13 = dVar13 * dVar11;
        dVar11 = dVar11 * dVar6;
        local_68[2] = local_68[2] - dVar13;
        local_68[3] = local_68[3] + dVar13;
        A->x[2][2] = dVar10 - dVar13;
        A->x[3][3] = dVar8 + dVar13;
        A->x[2][3] = 0.0;
        dVar7 = -dVar11;
        dVar12 = dVar11 / (dVar6 + 1.0);
        dVar9 = -dVar12;
        dVar10 = A->x[0][2];
        dVar8 = A->x[0][3];
        dVar13 = A->x[1][2];
        dVar6 = A->x[1][3];
        A->x[0][2] = (dVar12 * dVar10 + dVar8) * dVar7 + dVar10;
        A->x[0][3] = (dVar9 * dVar8 + dVar10) * dVar11 + dVar8;
        A->x[1][2] = (dVar12 * dVar13 + dVar6) * dVar7 + dVar13;
        A->x[1][3] = (dVar9 * dVar6 + dVar13) * dVar11 + dVar6;
        for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
          pdVar2 = (double *)((long)V->x[0] + lVar1 + 0x10);
          dVar10 = *pdVar2;
          dVar8 = pdVar2[1];
          pdVar2 = (double *)((long)V->x[0] + lVar1 + 0x10);
          *pdVar2 = (dVar12 * dVar10 + dVar8) * dVar7 + dVar10;
          pdVar2[1] = (dVar9 * dVar8 + dVar10) * dVar11 + dVar8;
        }
      }
      pdVar2 = (double *)A;
      for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
        dVar10 = local_68[lVar1] + (&S->x)[lVar1];
        (&S->x)[lVar1] = dVar10;
        *pdVar2 = dVar10;
        pdVar2 = pdVar2 + 5;
      }
      BVar5 = (anonymous_namespace)::maxOffDiagSymm<Imath_2_5::Matrix44<double>>(A);
    } while ((local_38 < BVar5) && (bVar4 = uVar3 < 0x13, uVar3 = uVar3 + 1, bVar4));
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix44<T>& A,
                   Vec4<T>& S,
                   Matrix44<T>& V,
                   const T tol)
{
    V.makeIdentity();

    for(int i = 0; i < 4; ++i) {
        S[i] = A[i][i];
    }

    const int maxIter = 20;  // In case we get really unlucky, prevents infinite loops
    const T absTol = tol * maxOffDiagSymm (A);  // Tolerance is in terms of the maximum
    if (absTol != 0)                        // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            ++numIter;
            Vec4<T> Z(0, 0, 0, 0);
            bool changed = jacobiRotation<0, 1, 2, 3> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<0, 3, 1, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 3, 0, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<2, 3, 0, 1> (A, V, Z, tol) || changed;
            for(int i = 0; i < 4; ++i) {
                A[i][i] = S[i] += Z[i];
            }
           if (!changed)
                break;
        } while (maxOffDiagSymm(A) > absTol && numIter < maxIter);
    }
}